

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

bool __thiscall mkvmuxer::Frame::Init(Frame *this,uint8_t *frame,uint64_t length)

{
  uint8_t *__dest;
  
  __dest = (uint8_t *)operator_new__(length,(nothrow_t *)&std::nothrow);
  if (__dest != (uint8_t *)0x0) {
    if (this->frame_ != (uint8_t *)0x0) {
      operator_delete__(this->frame_);
    }
    this->frame_ = __dest;
    this->length_ = length;
    memcpy(__dest,frame,length);
  }
  return __dest != (uint8_t *)0x0;
}

Assistant:

bool Frame::Init(const uint8_t* frame, uint64_t length) {
  uint8_t* const data =
      new (std::nothrow) uint8_t[static_cast<size_t>(length)];  // NOLINT
  if (!data)
    return false;

  delete[] frame_;
  frame_ = data;
  length_ = length;

  memcpy(frame_, frame, static_cast<size_t>(length_));
  return true;
}